

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O3

void Omega_h::fix_momentum_velocity_verts
               (Mesh *mesh,
               vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_> *class_pairs,Int comp
               )

{
  int *piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Alloc *pAVar3;
  undefined8 uVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  bool bVar6;
  uint uVar7;
  char *__end;
  uint ent_dim;
  ulong uVar8;
  Alloc *pAVar9;
  Read<signed_char> comp_marks;
  Bytes new_marks;
  Read<signed_char> old_marks;
  Read<signed_char> ent_marks;
  undefined1 local_100 [36];
  int local_dc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  Alloc **local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  Read<signed_char> local_b8;
  Read<signed_char> local_a8;
  Bytes local_98;
  Bytes local_88;
  Read<signed_char> local_78;
  Alloc *local_68;
  void *local_60;
  Alloc *local_58;
  element_type *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  void *local_40;
  vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_> *local_38;
  
  uVar7 = mesh->dim_;
  local_38 = class_pairs;
  if (uVar7 < 4) {
    pAVar3 = (Alloc *)(local_100 + 0x10);
    ent_dim = 0;
    local_dc = (int)(char)(1 << ((byte)comp & 0x1f));
    local_c0 = &local_d8;
    local_c8 = &local_68;
    do {
      if ((int)uVar7 < (int)ent_dim) {
        return;
      }
      mark_class_closures((Omega_h *)&local_48,mesh,ent_dim,local_38);
      local_78.write_.shared_alloc_.alloc = (Alloc *)local_48._M_pi;
      if (((ulong)local_48._M_pi & 7) == 0 && (Alloc *)local_48._M_pi != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_78.write_.shared_alloc_.alloc =
               (Alloc *)((long)(local_48._M_pi)->_vptr__Sp_counted_base * 8 + 1);
        }
        else {
          *(int *)&local_48._M_pi[3]._vptr__Sp_counted_base =
               *(int *)&local_48._M_pi[3]._vptr__Sp_counted_base + 1;
        }
      }
      local_78.write_.shared_alloc_.direct_ptr = local_40;
      multiply_each_by<signed_char>((Omega_h *)local_d8._M_local_buf,&local_78,(char)local_dc);
      pAVar9 = local_78.write_.shared_alloc_.alloc;
      if (((ulong)local_78.write_.shared_alloc_.alloc & 7) == 0 &&
          local_78.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_78.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_78.write_.shared_alloc_.alloc);
          operator_delete(pAVar9,0x48);
        }
      }
      local_100._0_8_ = pAVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_100,"momentum_velocity_fixed","");
      bVar6 = Mesh::has_tag(mesh,ent_dim,(string *)local_100);
      if ((Alloc *)local_100._0_8_ != pAVar3) {
        operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
      }
      if (bVar6) {
        local_100._0_8_ = pAVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_100,"momentum_velocity_fixed","");
        Mesh::get_array<signed_char>((Mesh *)&local_58,(Int)mesh,(string *)(ulong)ent_dim);
        if ((Alloc *)local_100._0_8_ != pAVar3) {
          operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
        }
        local_88.write_.shared_alloc_.alloc = local_58;
        if (((ulong)local_58 & 7) == 0 && local_58 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_88.write_.shared_alloc_.alloc = (Alloc *)(local_58->size * 8 + 1);
          }
          else {
            local_58->use_count = local_58->use_count + 1;
          }
        }
        local_88.write_.shared_alloc_.direct_ptr = local_50;
        local_98.write_.shared_alloc_.alloc = (Alloc *)local_d8._M_allocated_capacity;
        if ((local_d8._M_allocated_capacity & 7) == 0 &&
            (Alloc *)local_d8._M_allocated_capacity != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_98.write_.shared_alloc_.alloc =
                 (Alloc *)(*(long *)local_d8._M_allocated_capacity * 8 + 1);
          }
          else {
            *(int *)(local_d8._M_allocated_capacity + 0x30) =
                 *(int *)(local_d8._M_allocated_capacity + 0x30) + 1;
          }
        }
        local_98.write_.shared_alloc_.direct_ptr = (void *)local_d8._8_8_;
        bit_or_each((Omega_h *)&local_68,&local_88,&local_98);
        pAVar9 = local_98.write_.shared_alloc_.alloc;
        if (((ulong)local_98.write_.shared_alloc_.alloc & 7) == 0 &&
            local_98.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_98.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_98.write_.shared_alloc_.alloc);
            operator_delete(pAVar9,0x48);
          }
        }
        pAVar9 = local_88.write_.shared_alloc_.alloc;
        if (((ulong)local_88.write_.shared_alloc_.alloc & 7) == 0 &&
            local_88.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_88.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_88.write_.shared_alloc_.alloc);
            operator_delete(pAVar9,0x48);
          }
        }
        local_100._0_8_ = pAVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_100,"momentum_velocity_fixed","");
        local_a8.write_.shared_alloc_.alloc = local_68;
        if (((ulong)local_68 & 7) == 0 && local_68 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_a8.write_.shared_alloc_.alloc = (Alloc *)(local_68->size * 8 + 1);
          }
          else {
            local_68->use_count = local_68->use_count + 1;
          }
        }
        local_a8.write_.shared_alloc_.direct_ptr = local_60;
        Mesh::set_tag<signed_char>(mesh,ent_dim,(string *)local_100,&local_a8,false);
        pAVar9 = local_a8.write_.shared_alloc_.alloc;
        if (((ulong)local_a8.write_.shared_alloc_.alloc & 7) == 0 &&
            local_a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_a8.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_a8.write_.shared_alloc_.alloc);
            operator_delete(pAVar9,0x48);
          }
        }
        if ((Alloc *)local_100._0_8_ != pAVar3) {
          operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
        }
        pAVar9 = local_68;
        if (((ulong)local_68 & 7) == 0 && local_68 != (Alloc *)0x0) {
          piVar1 = &local_68->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_68);
            operator_delete(pAVar9,0x48);
          }
        }
        pAVar9 = local_58;
        if (((ulong)local_58 & 7) == 0 && local_58 != (Alloc *)0x0) {
          piVar1 = &local_58->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_58);
            uVar8 = 0x48;
            goto LAB_00281bae;
          }
        }
      }
      else {
        local_100._0_8_ = pAVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_100,"momentum_velocity_fixed","");
        local_b8.write_.shared_alloc_.alloc = (Alloc *)local_d8._M_allocated_capacity;
        if ((local_d8._M_allocated_capacity & 7) == 0 &&
            (Alloc *)local_d8._M_allocated_capacity != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_b8.write_.shared_alloc_.alloc =
                 (Alloc *)(*(long *)local_d8._M_allocated_capacity * 8 + 1);
          }
          else {
            *(int *)(local_d8._M_allocated_capacity + 0x30) =
                 *(int *)(local_d8._M_allocated_capacity + 0x30) + 1;
          }
        }
        local_b8.write_.shared_alloc_.direct_ptr = (void *)local_d8._8_8_;
        Mesh::add_tag<signed_char>(mesh,ent_dim,(string *)local_100,1,&local_b8,false);
        pAVar9 = local_b8.write_.shared_alloc_.alloc;
        if (((ulong)local_b8.write_.shared_alloc_.alloc & 7) == 0 &&
            local_b8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_b8.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_b8.write_.shared_alloc_.alloc);
            operator_delete(pAVar9,0x48);
          }
        }
        if ((Alloc *)local_100._0_8_ != pAVar3) {
          uVar8 = local_100._16_8_ + 1;
          pAVar9 = (Alloc *)local_100._0_8_;
LAB_00281bae:
          operator_delete(pAVar9,uVar8);
        }
      }
      uVar4 = local_d8._M_allocated_capacity;
      if ((local_d8._M_allocated_capacity & 7) == 0 &&
          (Alloc *)local_d8._M_allocated_capacity != (Alloc *)0x0) {
        piVar1 = (int *)(local_d8._M_allocated_capacity + 0x30);
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc((Alloc *)local_d8._M_allocated_capacity);
          operator_delete((void *)uVar4,0x48);
        }
      }
      _Var5._M_pi = local_48._M_pi;
      if (((ulong)local_48._M_pi & 7) == 0 && (Alloc *)local_48._M_pi != (Alloc *)0x0) {
        p_Var2 = local_48._M_pi + 3;
        *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
        if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
          Alloc::~Alloc((Alloc *)local_48._M_pi);
          operator_delete(_Var5._M_pi,0x48);
        }
      }
      ent_dim = ent_dim + 1;
      uVar7 = mesh->dim_;
    } while (uVar7 < 4);
  }
  fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
       ,0x33);
}

Assistant:

void fix_momentum_velocity_verts(
    Mesh* mesh, std::vector<ClassPair> const& class_pairs, Int comp) {
  for (Int ent_dim = VERT; ent_dim <= mesh->dim(); ++ent_dim) {
    auto ent_marks = mark_class_closures(mesh, ent_dim, class_pairs);
    auto comp_marks = multiply_each_by(ent_marks, I8(1 << comp));
    if (mesh->has_tag(ent_dim, "momentum_velocity_fixed")) {
      auto old_marks = mesh->get_array<I8>(ent_dim, "momentum_velocity_fixed");
      auto new_marks = bit_or_each(old_marks, comp_marks);
      mesh->set_tag(ent_dim, "momentum_velocity_fixed", new_marks);
    } else {
      mesh->add_tag(ent_dim, "momentum_velocity_fixed", 1, comp_marks);
    }
  }
}